

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

bool __thiscall
Bitmap_Operation::BitmapInfoHeader::validate(BitmapInfoHeader *this,BitmapFileHeader *header)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  long in_RSI;
  long *in_RDI;
  uint32_t rowSize;
  undefined3 uVar6;
  int in_stack_ffffffffffffff44;
  short local_84;
  int local_50;
  uint local_1c;
  
  iVar5 = (**(code **)(*in_RDI + 0x20))();
  bVar4 = (**(code **)(*in_RDI + 0x30))();
  local_1c = iVar5 * (uint)bVar4;
  if ((local_1c & 3) != 0) {
    local_1c = ((local_1c >> 2) + 1) * 4;
  }
  bVar3 = false;
  bVar2 = false;
  if (((*(short *)((long)in_RDI + 0x16) == 8) || (*(short *)((long)in_RDI + 0x16) == 0x18)) ||
     (in_stack_ffffffffffffff44 = CONCAT13(1,(int3)in_stack_ffffffffffffff44),
     *(short *)((long)in_RDI + 0x16) == 0x20)) {
    uVar6 = (undefined3)in_stack_ffffffffffffff44;
    in_stack_ffffffffffffff44 = CONCAT13(1,uVar6);
    if ((0 < *(int *)((long)in_RDI + 0xc)) &&
       (in_stack_ffffffffffffff44 = CONCAT13(1,uVar6), 0 < (int)in_RDI[2])) {
      iVar5 = (int)in_RDI[1];
      BitmapInfoHeader((BitmapInfoHeader *)CONCAT44(in_stack_ffffffffffffff44,iVar5));
      bVar3 = true;
      uVar6 = (undefined3)in_stack_ffffffffffffff44;
      in_stack_ffffffffffffff44 = CONCAT13(1,uVar6);
      if ((iVar5 == local_50) &&
         ((*(int *)((long)in_RDI + 0x1c) == local_1c * (int)in_RDI[2] ||
          (in_stack_ffffffffffffff44 = CONCAT13(1,uVar6), *(int *)((long)in_RDI + 0x1c) == 0)))) {
        sVar1 = *(short *)((long)in_RDI + 0x14);
        BitmapInfoHeader((BitmapInfoHeader *)CONCAT44(CONCAT13(1,uVar6),iVar5));
        bVar2 = true;
        in_stack_ffffffffffffff44 = 0x1000000;
        if (sVar1 == local_84) {
          in_stack_ffffffffffffff44 =
               (uint)(*(uint *)(in_RSI + 0xc) < (uint)((int)in_RDI[6] + *(int *)(in_RSI + 0x10))) <<
               0x18;
        }
      }
    }
  }
  if (bVar2) {
    ~BitmapInfoHeader((BitmapInfoHeader *)0x130d09);
  }
  if (bVar3) {
    ~BitmapInfoHeader((BitmapInfoHeader *)0x130d1c);
  }
  return SUB41((uint)in_stack_ffffffffffffff44 >> 0x18,0);
}

Assistant:

virtual bool validate( const BitmapFileHeader & header )
        {
            uint32_t rowSize = width() * colorCount();
            if( rowSize % BITMAP_ALIGNMENT != 0 )
                rowSize = (rowSize / BITMAP_ALIGNMENT + 1) * BITMAP_ALIGNMENT;

            return !(biBitCount == 8u || biBitCount == 24u || biBitCount == 32u) ||
                biWidth <= 0 || biHeight <= 0 || biSize != BitmapInfoHeader().biSize ||
                (biSizeImage != rowSize * static_cast<uint32_t>(biHeight) && biSizeImage != 0) ||
                biPlanes != BitmapInfoHeader().biPlanes || header.bfOffBits < overallSize + header.overallSize;
        }